

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack28_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x10000000 | uVar1 - base;
  uVar2 = in[1] - base >> 4;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x1000000 | uVar2;
  uVar2 = in[2] - base >> 8;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x100000 | uVar2;
  uVar2 = in[3] - base >> 0xc;
  out[3] = uVar2;
  out[3] = (in[4] - base) * 0x10000 | uVar2;
  uVar2 = in[4] - base >> 0x10;
  out[4] = uVar2;
  out[4] = (in[5] - base) * 0x1000 | uVar2;
  uVar2 = in[5] - base >> 0x14;
  out[5] = uVar2;
  out[5] = (in[6] - base) * 0x100 | uVar2;
  uVar2 = in[6] - base >> 0x18;
  out[6] = uVar2;
  out[6] = (in[7] - base) * 0x10 | uVar2;
  uVar1 = in[8];
  out[7] = uVar1 - base;
  out[7] = (in[9] - base) * 0x10000000 | uVar1 - base;
  uVar2 = in[9] - base >> 4;
  out[8] = uVar2;
  out[8] = (in[10] - base) * 0x1000000 | uVar2;
  uVar2 = in[10] - base >> 8;
  out[9] = uVar2;
  out[9] = (in[0xb] - base) * 0x100000 | uVar2;
  uVar2 = in[0xb] - base >> 0xc;
  out[10] = uVar2;
  out[10] = (in[0xc] - base) * 0x10000 | uVar2;
  uVar2 = in[0xc] - base >> 0x10;
  out[0xb] = uVar2;
  out[0xb] = (in[0xd] - base) * 0x1000 | uVar2;
  uVar2 = in[0xd] - base >> 0x14;
  out[0xc] = uVar2;
  out[0xc] = (in[0xe] - base) * 0x100 | uVar2;
  uVar2 = in[0xe] - base >> 0x18;
  out[0xd] = uVar2;
  out[0xd] = (in[0xf] - base) * 0x10 | uVar2;
  return out + 0xe;
}

Assistant:

uint32_t * pack28_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  24 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  24 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 28  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++out;
    ++in;

    return out;
}